

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

CasedString * __thiscall
Catch::Matchers::Impl::StdString::CasedString::adjustString(CasedString *this,string *str)

{
  string *in_RDX;
  string *str_local;
  CasedString *this_local;
  
  if (*(int *)str == 1) {
    toLower((Catch *)this,in_RDX);
  }
  else {
    std::__cxx11::string::string((string *)this,(string *)in_RDX);
  }
  return this;
}

Assistant:

std::string adjustString(std::string const& str) const {
						return m_caseSensitivity == CaseSensitive::No
							? toLower(str)
							: str;

					}